

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O0

void QBenchmarkPerfEventsMeasurer::listCounters(void)

{
  bool bVar1;
  Events *ev;
  Events *__end1;
  Events *__begin1;
  Events (*__range1) [84];
  char *local_40;
  char *local_38;
  char *local_30;
  Events *local_10;
  
  bVar1 = isAvailable();
  if (bVar1) {
    printf("The following performance counters are available:\n");
    for (local_10 = eventlist; local_10 != (Events *)"alignment-faults"; local_10 = local_10 + 1) {
      if (local_10->type == 0) {
        local_30 = "hardware";
      }
      else {
        if (local_10->type == 1) {
          local_38 = "software";
        }
        else {
          if (local_10->type == 3) {
            local_40 = "cache";
          }
          else {
            local_40 = "other";
          }
          local_38 = local_40;
        }
        local_30 = local_38;
      }
      printf("  %-30s [%s]\n","alignment-faults" + local_10->offset,local_30);
    }
  }
  else {
    printf("Performance counters are not available on this system\n");
  }
  return;
}

Assistant:

void QBenchmarkPerfEventsMeasurer::listCounters()
{
    if (!isAvailable()) {
        printf("Performance counters are not available on this system\n");
        return;
    }

    printf("The following performance counters are available:\n");
    for (const Events &ev : eventlist) {
        printf("  %-30s [%s]\n", eventlist_strings + ev.offset,
               ev.type == PERF_TYPE_HARDWARE ? "hardware" :
               ev.type == PERF_TYPE_SOFTWARE ? "software" :
               ev.type == PERF_TYPE_HW_CACHE ? "cache" : "other");
    }
}